

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O2

void ihevc_intra_pred_chroma_mode_27_to_33
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  UWORD8 *pUVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  iVar1 = gai4_ihevc_ang_table_chroma[mode];
  uVar7 = 0;
  uVar6 = (ulong)(uint)nt;
  if (nt < 1) {
    uVar6 = uVar7;
  }
  pUVar2 = pu1_dst + 1;
  while (uVar7 != uVar6) {
    uVar7 = uVar7 + 1;
    uVar3 = iVar1 * (int)uVar7;
    uVar5 = uVar3 & 0x1f;
    iVar4 = ((int)uVar3 >> 4 & 0xfffffffeU) + nt * 4;
    for (lVar9 = 0; lVar9 < nt * 2; lVar9 = lVar9 + 2) {
      lVar8 = (long)(iVar4 + (int)lVar9);
      pUVar2[lVar9 + -1] =
           (UWORD8)((uint)pu1_ref[lVar8 + 2] * (0x20 - uVar5) + pu1_ref[lVar8 + 4] * uVar5 + 0x10 >>
                   5);
      lVar8 = (long)(iVar4 + (int)lVar9 + 1);
      pUVar2[lVar9] =
           (UWORD8)(pu1_ref[lVar8 + 4] * uVar5 + (uint)pu1_ref[lVar8 + 2] * (0x20 - uVar5) + 0x10 >>
                   5);
    }
    pUVar2 = pUVar2 + dst_strd;
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_27_to_33(UWORD8 *pu1_ref,
                                           WORD32 src_strd,
                                           UWORD8 *pu1_dst,
                                           WORD32 dst_strd,
                                           WORD32 nt,
                                           WORD32 mode)
{
    WORD32 row, col;
    WORD32 pos, fract;
    WORD32 intra_pred_ang;
    WORD32 idx, ref_main_idx_u, ref_main_idx_v;
    UNUSED(src_strd);


    intra_pred_ang = gai4_ihevc_ang_table_chroma[mode];

    for(row = 0; row < nt; row++)
    {
        pos = ((row + 1) * intra_pred_ang);
        idx = pos >> 5;
        fract = pos & (31);


        // Do linear filtering
        for(col = 0; col < (2 * nt); col += 2)
        {
            ref_main_idx_u = (4 * nt) + col + 2 * idx + 2;
            ref_main_idx_v = (4 * nt) + (col + 1) + 2 * idx + 2;
            pu1_dst[col + (row * dst_strd)] = (((32 - fract)
                            * pu1_ref[ref_main_idx_u]
                            + fract * pu1_ref[ref_main_idx_u + 2] + 16) >> 5);
            pu1_dst[(col + 1) + (row * dst_strd)] = (((32 - fract)
                            * pu1_ref[ref_main_idx_v]
                            + fract * pu1_ref[ref_main_idx_v + 2] + 16) >> 5);

        }
    }

}